

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O1

void __thiscall nesvis::Screen::draw(Screen *this,RenderWindow *window)

{
  Sprite sprite;
  Sprite local_148;
  
  local_148.super_Drawable._vptr_Drawable = (_func_int **)0x0;
  local_148.super_Transformable._vptr_Transformable = (_func_int **)0x0;
  sf::Texture::loadFromImage(&this->texture_,&this->image_,(IntRect *)&local_148);
  sf::Sprite::Sprite(&local_148);
  sf::Sprite::setTexture(&local_148,&this->texture_,true);
  sf::Transformable::setScale(&local_148.super_Transformable,this->scaling_,this->scaling_);
  sf::RenderTarget::draw
            (&window->super_RenderTarget,&local_148.super_Drawable,
             (RenderStates *)sf::RenderStates::Default);
  sf::Transformable::~Transformable(&local_148.super_Transformable);
  return;
}

Assistant:

void Screen::draw(sf::RenderWindow &window) {
    texture_.loadFromImage(image_);
    sf::Sprite sprite;
    sprite.setTexture(texture_, true);
    sprite.setScale(scaling_, scaling_);

    window.draw(sprite);
}